

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qglxintegration.cpp
# Opt level: O3

void __thiscall
QGLXContext::QGLXContext
          (QGLXContext *this,Display *display,QXcbScreen *screen,QSurfaceFormat *format,
          QPlatformOpenGLContext *share)

{
  QSurfaceFormat *this_00;
  undefined4 uVar1;
  long lVar2;
  bool bVar3;
  bool bVar4;
  char cVar5;
  byte bVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  GLXFBConfig config;
  char *pcVar10;
  XVisualInfo *visualInfo;
  Window WVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  long lVar14;
  pointer piVar15;
  RenderableType RVar16;
  uint uVar17;
  long lVar18;
  ulong uVar19;
  long in_FS_OFFSET;
  bool bVar20;
  bool local_103;
  code *local_100;
  QArrayDataPointer<QByteArray> local_c8;
  QList<int> local_a0;
  QList<int> local_88;
  QList<int> local_68;
  QSurfaceFormat local_48 [12];
  int local_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  QPlatformOpenGLContext::QPlatformOpenGLContext((QPlatformOpenGLContext *)this);
  *(undefined ***)this = &PTR__QGLXContext_00110f60;
  *(undefined ***)(this + 0x10) = &PTR__QGLXContext_00110fe0;
  *(Display **)(this + 0x18) = display;
  this_00 = (QSurfaceFormat *)(this + 0x38);
  *(undefined8 *)(this + 0x20) = 0;
  *(undefined8 *)(this + 0x28) = 0;
  *(undefined8 *)(this + 0x30) = 0;
  QSurfaceFormat::QSurfaceFormat(this_00,format);
  *(undefined2 *)(this + 0x40) = 0x100;
  *(undefined8 *)(this + 0x48) = 0;
  this[0x50] = (QGLXContext)0x0;
  iVar7 = QSurfaceFormat::renderableType();
  RVar16 = (RenderableType)this_00;
  if (iVar7 == 0) {
    QOpenGLContext::openGLModuleType();
    QSurfaceFormat::setRenderableType(RVar16);
  }
  iVar7 = QSurfaceFormat::renderableType();
  if ((iVar7 == 1) || (iVar7 = QSurfaceFormat::renderableType(), iVar7 == 2)) {
    if (share != (QPlatformOpenGLContext *)0x0) {
      *(undefined8 *)(this + 0x30) = *(undefined8 *)(share + 0x28);
    }
    uVar12 = *(undefined8 *)(this + 0x18);
    uVar1 = *(undefined4 *)(*(long *)(screen + 0x20) + 0x10);
    QSurfaceFormat::QSurfaceFormat(local_48,this_00);
    config = (GLXFBConfig)qglx_findConfig(uVar12,uVar1,local_48,0,1,0);
    QSurfaceFormat::~QSurfaceFormat(local_48);
    *(GLXFBConfig *)(this + 0x20) = config;
    if (config == (GLXFBConfig)0x0) {
      iVar7 = QSurfaceFormat::renderableType();
      if (iVar7 == 2) goto LAB_0010a1e0;
      visualInfo = (XVisualInfo *)
                   qglx_findVisualInfo(*(_XDisplay **)(this + 0x18),
                                       *(int *)(*(long *)(screen + 0x20) + 0x10),this_00,1,0);
      if (visualInfo == (XVisualInfo *)0x0) {
        QGLXContext((QGLXContext *)&local_c8);
        goto LAB_0010a7aa;
      }
      lVar14 = glXCreateContext(*(undefined8 *)(this + 0x18),visualInfo,*(undefined8 *)(this + 0x30)
                                ,1);
      *(long *)(this + 0x28) = lVar14;
      if ((lVar14 == 0) && (*(long *)(this + 0x30) != 0)) {
        *(undefined8 *)(this + 0x30) = 0;
        uVar12 = glXCreateContext(*(undefined8 *)(this + 0x18),visualInfo,0,1);
        *(undefined8 *)(this + 0x28) = uVar12;
      }
      WVar11 = createDummyWindow(*(Display **)(this + 0x18),visualInfo,
                                 *(int *)(*(long *)(screen + 0x20) + 0x10),
                                 (ulong)**(uint **)(*(long *)(screen + 0x20) + 8));
      XFree(visualInfo);
    }
    else {
      local_c8.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      local_c8.d._0_4_ = 0xaaaaaaaa;
      local_c8.d._4_4_ = 0xaaaaaaaa;
      local_c8.ptr._0_4_ = 0xaaaaaaaa;
      local_c8.ptr._4_4_ = 0xaaaaaaaa;
      pcVar10 = (char *)glXQueryExtensionsString
                                  (*(undefined8 *)(this + 0x18),
                                   *(undefined4 *)(*(long *)(screen + 0x20) + 0x10));
      QByteArray::QByteArray((QByteArray *)&local_68,pcVar10,-1);
      QByteArray::split((char)&local_c8);
      if (&(local_68.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_68.d.d)->super_QArrayData,1,0x10);
        }
      }
      bVar20 = true;
      if ((undefined1 *)local_c8.size == (undefined1 *)0x0) {
        local_100 = (code *)0x0;
LAB_00109c02:
        bVar3 = true;
LAB_00109c07:
        local_103 = true;
LAB_00109c0c:
        if ((undefined1 *)local_c8.size != (undefined1 *)0x0) {
          lVar2 = CONCAT44(local_c8.ptr._4_4_,local_c8.ptr._0_4_);
          lVar14 = local_c8.size * 0x18;
          lVar18 = 0;
          do {
            if (lVar14 == lVar18) goto LAB_00109cdd;
            local_68.d.d = (Data *)0x10e0a3;
            bVar4 = operator==((QByteArray *)(lVar2 + lVar18),(char **)&local_68);
            lVar18 = lVar18 + 0x18;
          } while (!bVar4);
          bVar20 = CONCAT44(local_c8.ptr._4_4_,local_c8.ptr._0_4_) - lVar2 == lVar18;
        }
      }
      else {
        lVar2 = CONCAT44(local_c8.ptr._4_4_,local_c8.ptr._0_4_);
        lVar14 = local_c8.size * 0x18;
        local_100 = (code *)0x0;
        lVar18 = 0;
        do {
          if (lVar14 == lVar18) goto LAB_00109b9d;
          local_68.d.d = (Data *)0x10e030;
          bVar3 = operator==((QByteArray *)(lVar2 + lVar18),(char **)&local_68);
          lVar18 = lVar18 + 0x18;
        } while (!bVar3);
        if (CONCAT44(local_c8.ptr._4_4_,local_c8.ptr._0_4_) - lVar2 == lVar18) {
          local_100 = (code *)0x0;
        }
        else {
          local_100 = (code *)glXGetProcAddress("glXCreateContextAttribsARB");
        }
LAB_00109b9d:
        if ((undefined1 *)local_c8.size == (undefined1 *)0x0) goto LAB_00109c02;
        lVar2 = CONCAT44(local_c8.ptr._4_4_,local_c8.ptr._0_4_);
        lVar14 = local_c8.size * 0x18;
        lVar18 = 0;
        do {
          local_103 = true;
          if (lVar14 == lVar18) {
            bVar3 = true;
            goto LAB_00109c75;
          }
          local_68.d.d = (Data *)0x10e062;
          bVar3 = operator==((QByteArray *)(lVar2 + lVar18),(char **)&local_68);
          lVar18 = lVar18 + 0x18;
        } while (!bVar3);
        bVar3 = CONCAT44(local_c8.ptr._4_4_,local_c8.ptr._0_4_) - lVar2 == lVar18;
LAB_00109c75:
        if ((undefined1 *)local_c8.size != (undefined1 *)0x0) {
          lVar2 = CONCAT44(local_c8.ptr._4_4_,local_c8.ptr._0_4_);
          lVar14 = local_c8.size * 0x18;
          lVar18 = 0;
          do {
            if (lVar14 == lVar18) goto LAB_00109c07;
            local_68.d.d = (Data *)0x10e081;
            bVar4 = operator==((QByteArray *)(lVar2 + lVar18),(char **)&local_68);
            lVar18 = lVar18 + 0x18;
          } while (!bVar4);
          local_103 = CONCAT44(local_c8.ptr._4_4_,local_c8.ptr._0_4_) - lVar2 == lVar18;
          goto LAB_00109c0c;
        }
        bVar20 = true;
      }
LAB_00109cdd:
      if (local_100 != (code *)0x0) {
        iVar7 = QSurfaceFormat::renderableType();
        if (iVar7 == 2) {
          if ((!bVar3) && ((undefined1 *)local_c8.size != (undefined1 *)0x0)) {
            lVar2 = CONCAT44(local_c8.ptr._4_4_,local_c8.ptr._0_4_);
            lVar14 = local_c8.size * 0x18;
            lVar18 = 0;
            do {
              if (lVar14 == lVar18) goto LAB_0010a140;
              local_68.d.d = (Data *)0x10e0c8;
              bVar4 = operator==((QByteArray *)(lVar2 + lVar18),(char **)&local_68);
              lVar18 = lVar18 + 0x18;
            } while (!bVar4);
            if (CONCAT44(local_c8.ptr._4_4_,local_c8.ptr._0_4_) - lVar2 != lVar18)
            goto LAB_00109d66;
          }
        }
        else {
LAB_00109d66:
          iVar8 = QSurfaceFormat::majorVersion();
          iVar9 = QSurfaceFormat::minorVersion();
          iVar7 = 9;
          if (iVar9 < 9) {
            iVar7 = iVar9;
          }
          iVar7 = iVar7 + iVar8 * 10;
          local_68.d.d = (Data *)0x0;
          local_68.d.ptr = (int *)0x0;
          local_68.d.size = 0;
          iVar8 = QSurfaceFormat::renderableType();
          if (iVar8 == 1) {
            if (0x2e < iVar7) {
              local_88.d.d = (Data *)CONCAT44(local_88.d.d._4_4_,iVar7);
              QtPrivate::QPodArrayOps<int>::emplace<int&>
                        ((QPodArrayOps<int> *)&local_68,local_68.d.size,(int *)&local_88);
              QList<int>::end(&local_68);
            }
            local_88.d.d._0_4_ = 0x2e;
            QtPrivate::QPodArrayOps<int>::emplace<int&>
                      ((QPodArrayOps<int> *)&local_68,local_68.d.size,(int *)&local_88);
            QList<int>::end(&local_68);
            local_88.d.d._0_4_ = 0x2d;
            QtPrivate::QPodArrayOps<int>::emplace<int&>
                      ((QPodArrayOps<int> *)&local_68,local_68.d.size,(int *)&local_88);
            QList<int>::end(&local_68);
            local_88.d.d._0_4_ = 0x2c;
            QtPrivate::QPodArrayOps<int>::emplace<int&>
                      ((QPodArrayOps<int> *)&local_68,local_68.d.size,(int *)&local_88);
            QList<int>::end(&local_68);
            local_88.d.d._0_4_ = 0x2b;
            QtPrivate::QPodArrayOps<int>::emplace<int&>
                      ((QPodArrayOps<int> *)&local_68,local_68.d.size,(int *)&local_88);
            QList<int>::end(&local_68);
            local_88.d.d._0_4_ = 0x2a;
            QtPrivate::QPodArrayOps<int>::emplace<int&>
                      ((QPodArrayOps<int> *)&local_68,local_68.d.size,(int *)&local_88);
            QList<int>::end(&local_68);
            local_88.d.d._0_4_ = 0x29;
            QtPrivate::QPodArrayOps<int>::emplace<int&>
                      ((QPodArrayOps<int> *)&local_68,local_68.d.size,(int *)&local_88);
            QList<int>::end(&local_68);
            local_88.d.d._0_4_ = 0x28;
            QtPrivate::QPodArrayOps<int>::emplace<int&>
                      ((QPodArrayOps<int> *)&local_68,local_68.d.size,(int *)&local_88);
            QList<int>::end(&local_68);
            local_88.d.d._0_4_ = 0x21;
            QtPrivate::QPodArrayOps<int>::emplace<int&>
                      ((QPodArrayOps<int> *)&local_68,local_68.d.size,(int *)&local_88);
            QList<int>::end(&local_68);
            local_88.d.d._0_4_ = 0x20;
            QtPrivate::QPodArrayOps<int>::emplace<int&>
                      ((QPodArrayOps<int> *)&local_68,local_68.d.size,(int *)&local_88);
            QList<int>::end(&local_68);
            local_88.d.d._0_4_ = 0x1f;
            QtPrivate::QPodArrayOps<int>::emplace<int&>
                      ((QPodArrayOps<int> *)&local_68,local_68.d.size,(int *)&local_88);
            QList<int>::end(&local_68);
            local_88.d.d._0_4_ = 0x1e;
            QtPrivate::QPodArrayOps<int>::emplace<int&>
                      ((QPodArrayOps<int> *)&local_68,local_68.d.size,(int *)&local_88);
            QList<int>::end(&local_68);
            local_88.d.d._0_4_ = 0x15;
            QtPrivate::QPodArrayOps<int>::emplace<int&>
                      ((QPodArrayOps<int> *)&local_68,local_68.d.size,(int *)&local_88);
            QList<int>::end(&local_68);
            local_88.d.d = (Data *)CONCAT44(local_88.d.d._4_4_,0x14);
            QtPrivate::QPodArrayOps<int>::emplace<int&>
                      ((QPodArrayOps<int> *)&local_68,local_68.d.size,(int *)&local_88);
            QList<int>::end(&local_68);
          }
          else {
            iVar8 = QSurfaceFormat::renderableType();
            if (iVar8 == 2) {
              if (0x20 < iVar7) {
                local_88.d.d = (Data *)CONCAT44(local_88.d.d._4_4_,iVar7);
                QtPrivate::QPodArrayOps<int>::emplace<int&>
                          ((QPodArrayOps<int> *)&local_68,local_68.d.size,(int *)&local_88);
                QList<int>::end(&local_68);
              }
              local_88.d.d._0_4_ = 0x20;
              QtPrivate::QPodArrayOps<int>::emplace<int&>
                        ((QPodArrayOps<int> *)&local_68,local_68.d.size,(int *)&local_88);
              QList<int>::end(&local_68);
              local_88.d.d._0_4_ = 0x1f;
              QtPrivate::QPodArrayOps<int>::emplace<int&>
                        ((QPodArrayOps<int> *)&local_68,local_68.d.size,(int *)&local_88);
              QList<int>::end(&local_68);
              local_88.d.d._0_4_ = 0x1e;
              QtPrivate::QPodArrayOps<int>::emplace<int&>
                        ((QPodArrayOps<int> *)&local_68,local_68.d.size,(int *)&local_88);
              QList<int>::end(&local_68);
              local_88.d.d = (Data *)CONCAT44(local_88.d.d._4_4_,0x14);
              QtPrivate::QPodArrayOps<int>::emplace<int&>
                        ((QPodArrayOps<int> *)&local_68,local_68.d.size,(int *)&local_88);
              QList<int>::end(&local_68);
              QSurfaceFormat::setOptions(this_00,0);
            }
          }
          if (share != (QPlatformOpenGLContext *)0x0) {
            (**(code **)(*(long *)share + 0x18))((QSurfaceFormat *)&local_88);
            cVar5 = QSurfaceFormat::testOption((FormatOption)(QSurfaceFormat *)&local_88);
            QSurfaceFormat::~QSurfaceFormat((QSurfaceFormat *)&local_88);
            if (cVar5 != '\0') {
              QSurfaceFormat::setOption(RVar16,true);
            }
          }
          if (*(long *)(this + 0x28) == 0) {
            uVar19 = 0;
            do {
              if ((ulong)local_68.d.size <= uVar19) break;
              piVar15 = QList<int>::data(&local_68);
              iVar8 = piVar15[uVar19];
              if (iVar8 <= iVar7) {
                local_88.d.d = (Data *)0x0;
                local_88.d.ptr = (int *)0x0;
                local_88.d.size = 0;
                local_a0.d.d._0_4_ = 0x2091;
                QtPrivate::QPodArrayOps<int>::emplace<int&>
                          ((QPodArrayOps<int> *)&local_88,0,(int *)&local_a0);
                QList<int>::end(&local_88);
                local_a0.d.d._0_4_ = iVar8 / 10;
                QtPrivate::QPodArrayOps<int>::emplace<int&>
                          ((QPodArrayOps<int> *)&local_88,local_88.d.size,(int *)&local_a0);
                QList<int>::end(&local_88);
                local_a0.d.d._0_4_ = 0x2092;
                QtPrivate::QPodArrayOps<int>::emplace<int&>
                          ((QPodArrayOps<int> *)&local_88,local_88.d.size,(int *)&local_a0);
                QList<int>::end(&local_88);
                local_a0.d.d = (Data *)CONCAT44(local_a0.d.d._4_4_,iVar8 % 10);
                QtPrivate::QPodArrayOps<int>::emplace<int&>
                          ((QPodArrayOps<int> *)&local_88,local_88.d.size,(int *)&local_a0);
                QList<int>::end(&local_88);
                iVar9 = QSurfaceFormat::renderableType();
                if (iVar9 == 1) {
                  if (0x1f < iVar8 && !bVar3) {
                    iVar9 = QSurfaceFormat::profile();
                    if (iVar9 == 1) {
                      local_a0.d.d._0_4_ = 0x9126;
                      QtPrivate::QPodArrayOps<int>::emplace<int&>
                                ((QPodArrayOps<int> *)&local_88,local_88.d.size,(int *)&local_a0);
                      QList<int>::end(&local_88);
                      local_a0.d.d = (Data *)CONCAT44(local_a0.d.d._4_4_,1);
                    }
                    else {
                      local_a0.d.d._0_4_ = 0x9126;
                      QtPrivate::QPodArrayOps<int>::emplace<int&>
                                ((QPodArrayOps<int> *)&local_88,local_88.d.size,(int *)&local_a0);
                      QList<int>::end(&local_88);
                      local_a0.d.d = (Data *)CONCAT44(local_a0.d.d._4_4_,2);
                    }
                    QtPrivate::QPodArrayOps<int>::emplace<int&>
                              ((QPodArrayOps<int> *)&local_88,local_88.d.size,(int *)&local_a0);
                    QList<int>::end(&local_88);
                  }
                  bVar6 = QSurfaceFormat::testOption(RVar16);
                  uVar17 = (uint)bVar6 | (uint)(local_103 ^ 1) << 2;
                  if ((iVar8 < 0x1e) || (cVar5 = QSurfaceFormat::testOption(RVar16), cVar5 != '\0'))
                  {
                    if (uVar17 == 0) goto LAB_0010a51c;
                  }
                  else {
                    uVar17 = uVar17 | 2;
                  }
                  local_a0.d.d._0_4_ = 0x2094;
                  QtPrivate::QPodArrayOps<int>::emplace<int&>
                            ((QPodArrayOps<int> *)&local_88,local_88.d.size,(int *)&local_a0);
                  QList<int>::end(&local_88);
                  local_a0.d.d = (Data *)CONCAT44(local_a0.d.d._4_4_,uVar17);
LAB_0010a501:
                  QtPrivate::QPodArrayOps<int>::emplace<int&>
                            ((QPodArrayOps<int> *)&local_88,local_88.d.size,(int *)&local_a0);
                  QList<int>::end(&local_88);
                }
                else {
                  iVar8 = QSurfaceFormat::renderableType();
                  if (iVar8 == 2) {
                    local_a0.d.d._0_4_ = 0x9126;
                    QtPrivate::QPodArrayOps<int>::emplace<int&>
                              ((QPodArrayOps<int> *)&local_88,local_88.d.size,(int *)&local_a0);
                    QList<int>::end(&local_88);
                    local_a0.d.d = (Data *)CONCAT44(local_a0.d.d._4_4_,4);
                    goto LAB_0010a501;
                  }
                }
LAB_0010a51c:
                if ((local_103 == false) &&
                   (cVar5 = QSurfaceFormat::testOption(RVar16), cVar5 != '\0')) {
                  local_a0.d.d = local_88.d.d;
                  local_a0.d.ptr = local_88.d.ptr;
                  local_a0.d.size = local_88.d.size;
                  if (&(local_88.d.d)->super_QArrayData != (QArrayData *)0x0) {
                    LOCK();
                    ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                         ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                         _M_i + 1;
                    UNLOCK();
                  }
                  local_3c = 0x8256;
                  QtPrivate::QPodArrayOps<int>::emplace<int&>
                            ((QPodArrayOps<int> *)&local_a0,local_88.d.size,&local_3c);
                  QList<int>::end(&local_a0);
                  local_3c = 0x8252;
                  QtPrivate::QPodArrayOps<int>::emplace<int&>
                            ((QPodArrayOps<int> *)&local_a0,local_a0.d.size,&local_3c);
                  QList<int>::end(&local_a0);
                  if (!bVar20) {
                    local_3c = 0x20f7;
                    QtPrivate::QPodArrayOps<int>::emplace<int&>
                              ((QPodArrayOps<int> *)&local_a0,local_a0.d.size,&local_3c);
                    QList<int>::end(&local_a0);
                    local_3c = 1;
                    QtPrivate::QPodArrayOps<int>::emplace<int&>
                              ((QPodArrayOps<int> *)&local_a0,local_a0.d.size,&local_3c);
                    QList<int>::end(&local_a0);
                  }
                  local_3c = 0;
                  QtPrivate::QPodArrayOps<int>::emplace<int&>
                            ((QPodArrayOps<int> *)&local_a0,local_a0.d.size,&local_3c);
                  QList<int>::end(&local_a0);
                  uVar12 = *(undefined8 *)(this + 0x18);
                  uVar13 = *(undefined8 *)(this + 0x30);
                  piVar15 = QList<int>::data(&local_a0);
                  uVar12 = (*local_100)(uVar12,config,uVar13,1,piVar15);
                  *(undefined8 *)(this + 0x28) = uVar12;
                  if (&(local_a0.d.d)->super_QArrayData != (QArrayData *)0x0) {
                    LOCK();
                    ((local_a0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                         ((local_a0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                         _M_i + -1;
                    UNLOCK();
                    if (((local_a0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                        _M_i == 0) {
                      QArrayData::deallocate(&(local_a0.d.d)->super_QArrayData,4,0x10);
                    }
                  }
                }
                if (*(long *)(this + 0x28) == 0) {
                  local_a0.d.d = (Data *)((ulong)local_a0.d.d & 0xffffffff00000000);
                  QtPrivate::QPodArrayOps<int>::emplace<int&>
                            ((QPodArrayOps<int> *)&local_88,local_88.d.size,(int *)&local_a0);
                  QList<int>::end(&local_88);
                  uVar12 = *(undefined8 *)(this + 0x18);
                  uVar13 = *(undefined8 *)(this + 0x30);
                  piVar15 = QList<int>::data(&local_88);
                  lVar14 = (*local_100)(uVar12,config,uVar13,1,piVar15);
                  *(long *)(this + 0x28) = lVar14;
                  if ((lVar14 == 0) && (*(long *)(this + 0x30) != 0)) {
                    uVar12 = *(undefined8 *)(this + 0x18);
                    piVar15 = QList<int>::data(&local_88);
                    lVar14 = (*local_100)(uVar12,config,0,1,piVar15);
                    *(long *)(this + 0x28) = lVar14;
                    if (lVar14 != 0) {
                      *(undefined8 *)(this + 0x30) = 0;
                    }
                  }
                }
                else {
                  uVar12 = (**(code **)(*(long *)this + 0x60))(this);
                  *(undefined8 *)(this + 0x48) = uVar12;
                }
                if (&(local_88.d.d)->super_QArrayData != (QArrayData *)0x0) {
                  LOCK();
                  ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                       ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                       _M_i + -1;
                  UNLOCK();
                  if (((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                      == 0) {
                    QArrayData::deallocate(&(local_88.d.d)->super_QArrayData,4,0x10);
                  }
                }
              }
              uVar19 = uVar19 + 1;
            } while (*(long *)(this + 0x28) == 0);
          }
          if (&(local_68.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1
            ;
            UNLOCK();
            if (((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
            {
              QArrayData::deallocate(&(local_68.d.d)->super_QArrayData,4,0x10);
            }
          }
        }
      }
LAB_0010a140:
      if (*(long *)(this + 0x28) != 0) goto LAB_0010a15a;
      iVar7 = QSurfaceFormat::renderableType();
      if (iVar7 == 2) {
        QArrayDataPointer<QByteArray>::~QArrayDataPointer(&local_c8);
        goto LAB_0010a1e0;
      }
      lVar14 = glXCreateNewContext(*(undefined8 *)(this + 0x18),config,0x8014,
                                   *(undefined8 *)(this + 0x30),1);
      *(long *)(this + 0x28) = lVar14;
      if ((lVar14 == 0) && (*(long *)(this + 0x30) != 0)) {
        lVar14 = glXCreateNewContext(*(undefined8 *)(this + 0x18),config,0x8014,0,1);
        *(long *)(this + 0x28) = lVar14;
        if (lVar14 != 0) {
          *(undefined8 *)(this + 0x30) = 0;
LAB_0010a15a:
          qglx_surfaceFormatFromGLXFBConfig(this_00,*(_XDisplay **)(this + 0x18),config,0);
        }
      }
      else if (lVar14 != 0) goto LAB_0010a15a;
      WVar11 = createDummyWindow(*(Display **)(this + 0x18),config,
                                 *(int *)(*(long *)(screen + 0x20) + 0x10),
                                 (ulong)**(uint **)(*(long *)(screen + 0x20) + 8));
      QArrayDataPointer<QByteArray>::~QArrayDataPointer(&local_c8);
    }
    if ((WVar11 != 0) && (*(long *)(this + 0x28) != 0)) {
      uVar12 = glXGetCurrentContext();
      uVar13 = glXGetCurrentDrawable();
      glXMakeCurrent(*(undefined8 *)(this + 0x18),WVar11,*(undefined8 *)(this + 0x28));
      updateFormatFromContext(this_00);
      glXMakeCurrent(*(undefined8 *)(this + 0x18),uVar13,uVar12);
    }
    XDestroyWindow(*(undefined8 *)(this + 0x18),WVar11);
  }
LAB_0010a1e0:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
LAB_0010a7aa:
  __stack_chk_fail();
}

Assistant:

QGLXContext::QGLXContext(Display *display, QXcbScreen *screen, const QSurfaceFormat &format, QPlatformOpenGLContext *share)
    : QPlatformOpenGLContext()
    , m_display(display)
    , m_format(format)
    , m_ownsContext(true)
{
    if (m_format.renderableType() == QSurfaceFormat::DefaultRenderableType)
        m_format.setRenderableType(QOpenGLContext::openGLModuleType() == QOpenGLContext::LibGL
                                   ? QSurfaceFormat::OpenGL : QSurfaceFormat::OpenGLES);
    if (m_format.renderableType() != QSurfaceFormat::OpenGL && m_format.renderableType() != QSurfaceFormat::OpenGLES)
        return;

    if (share)
        m_shareContext = static_cast<const QGLXContext*>(share)->glxContext();

    GLXFBConfig config = qglx_findConfig(m_display, screen->screenNumber(), m_format);
    m_config = config;
    XVisualInfo *visualInfo = nullptr;
    Window window = 0; // Temporary window used to query OpenGL context

    if (config) {
        const QByteArrayList glxExt = QByteArray(glXQueryExtensionsString(m_display, screen->screenNumber())).split(' ');

        // Resolve entry point for glXCreateContextAttribsARB
        glXCreateContextAttribsARBProc glXCreateContextAttribsARB = nullptr;
        if (glxExt.contains("GLX_ARB_create_context"))
            glXCreateContextAttribsARB = (glXCreateContextAttribsARBProc) glXGetProcAddress((const GLubyte*)"glXCreateContextAttribsARB");

        const bool supportsProfiles = glxExt.contains("GLX_ARB_create_context_profile");
        const bool supportsRobustness = glxExt.contains("GLX_ARB_create_context_robustness");
        const bool supportsVideoMemoryPurge = glxExt.contains("GLX_NV_robustness_video_memory_purge");

        // Use glXCreateContextAttribsARB if available
        // Also, GL ES context creation requires GLX_EXT_create_context_es2_profile
        if (glXCreateContextAttribsARB != nullptr
                && (m_format.renderableType() != QSurfaceFormat::OpenGLES || (supportsProfiles && glxExt.contains("GLX_EXT_create_context_es2_profile")))) {
            // Try to create an OpenGL context for each known OpenGL version in descending
            // order from the requested version.
            const int requestedVersion = m_format.majorVersion() * 10 + qMin(m_format.minorVersion(), 9);

            QList<int> glVersions;
            if (m_format.renderableType() == QSurfaceFormat::OpenGL) {
                if (requestedVersion > 46)
                    glVersions << requestedVersion;

                // Don't bother with versions below 2.0
                glVersions << 46 << 45 << 44 << 43 << 42 << 41 << 40 << 33 << 32 << 31 << 30 << 21 << 20;
            } else if (m_format.renderableType() == QSurfaceFormat::OpenGLES) {
                if (requestedVersion > 32)
                    glVersions << requestedVersion;

                // Don't bother with versions below ES 2.0
                glVersions << 32 << 31 << 30 << 20;
                // ES does not support any format option
                m_format.setOptions(QSurfaceFormat::FormatOptions());
            }
            // Robustness must match that of the shared context.
            if (share && share->format().testOption(QSurfaceFormat::ResetNotification))
                m_format.setOption(QSurfaceFormat::ResetNotification);
            Q_ASSERT(glVersions.size() > 0);

            for (int i = 0; !m_context && i < glVersions.size(); i++) {
                const int version = glVersions[i];
                if (version > requestedVersion)
                    continue;

                const int majorVersion = version / 10;
                const int minorVersion = version % 10;

                QList<int> contextAttributes;
                contextAttributes << GLX_CONTEXT_MAJOR_VERSION_ARB << majorVersion
                                  << GLX_CONTEXT_MINOR_VERSION_ARB << minorVersion;


                if (m_format.renderableType() == QSurfaceFormat::OpenGL) {
                    // If asking for OpenGL 3.2 or newer we should also specify a profile
                    if (version >= 32 && supportsProfiles) {
                        if (m_format.profile() == QSurfaceFormat::CoreProfile)
                            contextAttributes << GLX_CONTEXT_PROFILE_MASK_ARB << GLX_CONTEXT_CORE_PROFILE_BIT_ARB;
                        else
                            contextAttributes << GLX_CONTEXT_PROFILE_MASK_ARB << GLX_CONTEXT_COMPATIBILITY_PROFILE_BIT_ARB;
                    }

                    int flags = 0;

                    if (supportsRobustness)
                        flags |= GLX_CONTEXT_ROBUST_ACCESS_BIT_ARB;

                    if (m_format.testOption(QSurfaceFormat::DebugContext))
                        flags |= GLX_CONTEXT_DEBUG_BIT_ARB;

                    // A forward-compatible context may be requested for 3.0 and later
                    if (version >= 30 && !m_format.testOption(QSurfaceFormat::DeprecatedFunctions))
                        flags |= GLX_CONTEXT_FORWARD_COMPATIBLE_BIT_ARB;

                    if (flags != 0)
                        contextAttributes << GLX_CONTEXT_FLAGS_ARB << flags;
                } else if (m_format.renderableType() == QSurfaceFormat::OpenGLES) {
                    contextAttributes << GLX_CONTEXT_PROFILE_MASK_ARB << GLX_CONTEXT_ES2_PROFILE_BIT_EXT;
                }

                if (supportsRobustness && m_format.testOption(QSurfaceFormat::ResetNotification)) {
                    QList<int> contextAttributesWithRobustness = contextAttributes;
                    contextAttributesWithRobustness << GLX_CONTEXT_RESET_NOTIFICATION_STRATEGY_ARB << GLX_LOSE_CONTEXT_ON_RESET_ARB;
                    if (supportsVideoMemoryPurge)
                        contextAttributesWithRobustness << GLX_GENERATE_RESET_ON_VIDEO_MEMORY_PURGE_NV << GL_TRUE;

                    contextAttributesWithRobustness << None;
                    m_context = glXCreateContextAttribsARB(m_display, config, m_shareContext, true,
                                                           contextAttributesWithRobustness.data());
                    // Context creation against a shared context may fail specifically due to this request, so try
                    // without before dropping sharing.
                }

                if (m_context) {
                    m_getGraphicsResetStatus = reinterpret_cast<GLenum (QOPENGLF_APIENTRYP)()>(getProcAddress("glGetGraphicsResetStatusARB"));
                } else {
                    contextAttributes << None;
                    m_context = glXCreateContextAttribsARB(m_display, config, m_shareContext, true, contextAttributes.data());
                    if (!m_context && m_shareContext) {
                        // re-try without a shared glx context
                        m_context = glXCreateContextAttribsARB(m_display, config, nullptr, true, contextAttributes.data());
                        if (m_context)
                            m_shareContext = nullptr;
                    }
                }
            }
        }

        // Could not create a context using glXCreateContextAttribsARB, falling back to glXCreateNewContext.
        if (!m_context) {
            // requesting an OpenGL ES context requires glXCreateContextAttribsARB, so bail out
            if (m_format.renderableType() == QSurfaceFormat::OpenGLES)
                return;

            m_context = glXCreateNewContext(m_display, config, GLX_RGBA_TYPE, m_shareContext, true);
            if (!m_context && m_shareContext) {
                // re-try without a shared glx context
                m_context = glXCreateNewContext(m_display, config, GLX_RGBA_TYPE, nullptr, true);
                if (m_context)
                    m_shareContext = nullptr;
            }
        }

        // Get the basic surface format details
        if (m_context)
            qglx_surfaceFormatFromGLXFBConfig(&m_format, m_display, config);

        // Create a temporary window so that we can make the new context current
        window = createDummyWindow(m_display, config, screen->screenNumber(), screen->root());
    } else {
        // requesting an OpenGL ES context requires glXCreateContextAttribsARB, so bail out
        if (m_format.renderableType() == QSurfaceFormat::OpenGLES)
            return;

        // Note that m_format gets updated with the used surface format
        visualInfo = qglx_findVisualInfo(m_display, screen->screenNumber(), &m_format);
        if (Q_UNLIKELY(!visualInfo))
            qFatal("Could not initialize GLX");
        m_context = glXCreateContext(m_display, visualInfo, m_shareContext, true);
        if (!m_context && m_shareContext) {
            // re-try without a shared glx context
            m_shareContext = nullptr;
            m_context = glXCreateContext(m_display, visualInfo, nullptr, true);
        }

        // Create a temporary window so that we can make the new context current
        window = createDummyWindow(m_display, visualInfo, screen->screenNumber(), screen->root());
        XFree(visualInfo);
    }

    // Query the OpenGL version and profile
    if (m_context && window) {
        GLXContext prevContext = glXGetCurrentContext();
        GLXDrawable prevDrawable = glXGetCurrentDrawable();
        glXMakeCurrent(m_display, window, m_context);
        updateFormatFromContext(m_format);

        // Make our context non-current
        glXMakeCurrent(m_display, prevDrawable, prevContext);
    }

    // Destroy our temporary window
    XDestroyWindow(m_display, window);
}